

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentMap.cpp
# Opt level: O3

void __thiscall
EnvironmentMap::create_images
          (EnvironmentMap *this,shared_ptr<myvk::CommandPool> *command_pool,HdrImg *img,
          vector<double,_std::allocator<double>_> *weights_ptr)

{
  undefined4 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  int iVar7;
  undefined4 extraout_var;
  uint uVar8;
  initializer_list<VkImageMemoryBarrier> __l;
  initializer_list<VkBufferImageCopy> __l_00;
  initializer_list<VkBufferImageCopy> __l_01;
  initializer_list<VkImageMemoryBarrier> __l_02;
  allocator_type local_199;
  vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> local_198;
  vector<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_> local_178;
  vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> local_160;
  undefined1 local_148 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  uint32_t uStack_120;
  uint32_t uStack_11c;
  VkImageType VStack_118;
  VkFormat VStack_114;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::Buffer> alias_table_image_staging;
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::Buffer> hdr_image_staging;
  undefined1 local_c8 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  VkImage pVStack_a0;
  VkImageSubresourceRange local_98;
  VkImageMemoryBarrier local_80;
  Ptr<Device> *device;
  
  uVar8 = img->m_height * img->m_width;
  iVar7 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  device = (Ptr<Device> *)CONCAT44(extraout_var,iVar7);
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = img->m_width;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = img->m_height;
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)local_148,device,(VkExtent2D *)&local_198,1,VK_FORMAT_R32G32B32A32_SFLOAT,6,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  uVar5 = local_148._8_8_;
  uVar4 = local_148._0_8_;
  local_148._0_8_ = (element_type *)0x0;
  local_148._8_8_ = (element_type *)0x0;
  p_Var2 = (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_148._0_8_ =
       (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148._8_8_ =
       (this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
                    _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
                    _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
    }
  }
  myvk::ImageView::Create((ImageView *)local_c8,(Ptr<ImageBase> *)local_148,VK_IMAGE_VIEW_TYPE_2D,1)
  ;
  uVar5 = local_c8._8_8_;
  uVar4 = local_c8._0_8_;
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  p_Var2 = (this->m_hdr_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_hdr_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->m_hdr_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = img->m_width;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = img->m_height;
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Image::CreateTexture2D
            ((Image *)local_148,device,(VkExtent2D *)&local_198,1,VK_FORMAT_R32G32_UINT,6,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  uVar5 = local_148._8_8_;
  uVar4 = local_148._0_8_;
  local_148._0_8_ = (element_type *)0x0;
  local_148._8_8_ = (element_type *)0x0;
  p_Var2 = (this->m_alias_table_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_alias_table_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar4;
  (this->m_alias_table_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
  }
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_148._0_8_ =
       (this->m_alias_table_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_148._8_8_ =
       (this->m_alias_table_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
                    _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
      UNLOCK();
    }
    else {
      *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
               _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(((element_type *)local_148._8_8_)->super_enable_shared_from_this<myvk::Base>).
                    _M_weak_this.super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
      ;
    }
  }
  myvk::ImageView::Create((ImageView *)local_c8,(Ptr<ImageBase> *)local_148,VK_IMAGE_VIEW_TYPE_2D,1)
  ;
  uVar5 = local_c8._8_8_;
  uVar4 = local_c8._0_8_;
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  p_Var2 = (this->m_alias_table_image_view).
           super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_alias_table_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->m_alias_table_image_view).super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
    }
  }
  if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Buffer::CreateStaging<float*>
            ((Buffer *)&hdr_image_staging,device,img->m_data,img->m_data + uVar8 * 4,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_c8._0_8_ = (VmaAllocation)0x0;
  local_c8._8_8_ = (element_type *)0x0;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  myvk::Buffer::Create
            ((Buffer *)&alias_table_image_staging,device,(ulong)uVar8 << 3,0x404,1,
             VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  generate_alias_table
            (weights_ptr,
             (AliasPair *)
             (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->m_mapped_ptr);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )local_c8);
  local_148._0_8_ = (VmaAllocation)0x0;
  local_148._8_8_ = (element_type *)0x0;
  local_148._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_148._24_8_ = (element_type *)0x100000000;
  local_128 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uStack_120 = 0;
  uVar1 = img->m_width;
  uVar3 = img->m_height;
  VStack_114 = VK_FORMAT_R4G4_UNORM_PACK8;
  uStack_11c = uVar1;
  VStack_118 = uVar3;
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::Fence::Create((Fence *)&fence,device,0);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar6 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetDstMemoryBarrier
            ((VkImageMemoryBarrier *)local_c8,
             &((this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,(VkBufferImageCopy *)local_148,0,0x1000,
             VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  myvk::ImageBase::GetDstMemoryBarrier
            (&local_80,
             &((this->m_alias_table_image).
               super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase,
             (VkBufferImageCopy *)local_148,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0xffffffff,0xffffffff);
  __l._M_len = 2;
  __l._M_array = (iterator)local_c8;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_160,__l,&local_199);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar6,1,0x1000,(vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_198
             ,&local_178,&local_160);
  if (local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkExtent2D)
      local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_198.
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  peVar6 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_160.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_160.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_160.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_160.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_98.baseMipLevel = VStack_114;
  local_98.aspectMask = VStack_118;
  pVStack_a0 = (VkImage)CONCAT44(uStack_11c,uStack_120);
  local_a8._M_pi = local_128;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_;
  local_c8._0_8_ = local_148._0_8_;
  local_c8._8_8_ = local_148._8_8_;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_c8;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            (&local_198,__l_00,(allocator_type *)&local_199);
  myvk::CommandBuffer::CmdCopy
            (peVar6,(Ptr<BufferBase> *)&local_178,(Ptr<ImageBase> *)&local_160,&local_198,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
  if ((VkExtent2D)
      local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_198.
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_160.
               super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_178.
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  peVar6 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)alias_table_image_staging.
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)alias_table_image_staging.
                super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_alias_table_image).
                super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_alias_table_image).
                super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_160.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_160.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_160.
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                _M_impl.super__Vector_impl_data._M_finish)->pNext =
           *(int *)&(local_160.
                     super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->pNext + 1;
    }
  }
  local_98.baseMipLevel = VStack_114;
  local_98.aspectMask = VStack_118;
  pVStack_a0 = (VkImage)CONCAT44(uStack_11c,uStack_120);
  local_a8._M_pi = local_128;
  local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._24_8_;
  local_c8._0_8_ = local_148._0_8_;
  local_c8._8_8_ = local_148._8_8_;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_c8;
  std::vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>::vector
            (&local_198,__l_01,(allocator_type *)&local_199);
  myvk::CommandBuffer::CmdCopy
            (peVar6,(Ptr<BufferBase> *)&local_178,(Ptr<ImageBase> *)&local_160,&local_198,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL);
  if ((VkExtent2D)
      local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_198.
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_160.
               super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_178.
               super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
               _M_impl.super__Vector_impl_data._M_finish);
  }
  peVar6 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myvk::ImageBase::GetDstMemoryBarrier
            ((VkImageMemoryBarrier *)local_c8,
             &((this->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_ImageBase,(VkBufferImageCopy *)local_148,0x1000,0,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
             0xffffffff,0xffffffff);
  myvk::ImageBase::GetDstMemoryBarrier
            (&local_80,
             &((this->m_alias_table_image).
               super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase,
             (VkBufferImageCopy *)local_148,0x1000,0,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,0xffffffff,0xffffffff);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_c8;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (&local_160,__l_02,&local_199);
  myvk::CommandBuffer::CmdPipelineBarrier
            (peVar6,0x1000,0x2000,
             (vector<VkMemoryBarrier,_std::allocator<VkMemoryBarrier>_> *)&local_198,&local_178,
             &local_160);
  if ((element_type *)
      local_160.super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_160.
                    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_160.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.
                          super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_178.super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.
                    super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<VkBufferMemoryBarrier,_std::allocator<VkBufferMemoryBarrier>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((VkExtent2D)
      local_198.super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>._M_impl.
      super__Vector_impl_data._M_start != (VkExtent2D)0x0) {
    operator_delete(local_198.
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  if (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (alias_table_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (alias_table_image_staging.
               super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (hdr_image_staging.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void EnvironmentMap::create_images(const std::shared_ptr<myvk::CommandPool> &command_pool, const HdrImg &img,
                                   std::vector<double> *weights_ptr) {
	const uint32_t img_size = img.m_width * img.m_height;
	const VkDeviceSize img_bytes = img_size * sizeof(float) * 4;

	const std::shared_ptr<myvk::Device> &device = command_pool->GetDevicePtr();

	// create vulkan objects
	m_hdr_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32B32A32_SFLOAT,
	                                           VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_hdr_image_view = myvk::ImageView::Create(m_hdr_image, VK_IMAGE_VIEW_TYPE_2D);
	m_alias_table_image = myvk::Image::CreateTexture2D(device, {img.m_width, img.m_height}, 1, VK_FORMAT_R32G32_UINT,
	                                                   VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT);
	m_alias_table_image_view = myvk::ImageView::Create(m_alias_table_image, VK_IMAGE_VIEW_TYPE_2D);

	// create and fill staging objects
	std::shared_ptr<myvk::Buffer> hdr_image_staging =
	    myvk::Buffer::CreateStaging(device, img.m_data, img.m_data + img_size * 4);

	std::shared_ptr<myvk::Buffer> alias_table_image_staging = myvk::Buffer::CreateStaging<AliasPair>(
	    device, img_size, [weights_ptr](AliasPair *data) { generate_alias_table(weights_ptr, data); });

	// copy data
	VkBufferImageCopy region = {};
	region.bufferOffset = 0;
	region.bufferRowLength = 0;
	region.bufferImageHeight = 0;
	region.imageSubresource.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
	region.imageSubresource.mipLevel = 0;
	region.imageSubresource.baseArrayLayer = 0;
	region.imageSubresource.layerCount = 1;
	region.imageOffset = {0, 0, 0};
	region.imageExtent = {img.m_width, img.m_height, 1};

	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, {}, {},
	    {m_hdr_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                      VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL),
	     m_alias_table_image->GetDstMemoryBarrier(region, 0, VK_ACCESS_TRANSFER_WRITE_BIT, VK_IMAGE_LAYOUT_UNDEFINED,
	                                              VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL)});
	command_buffer->CmdCopy(hdr_image_staging, m_hdr_image, {region});
	command_buffer->CmdCopy(alias_table_image_staging, m_alias_table_image, {region});
	command_buffer->CmdPipelineBarrier(
	    VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT, {}, {},
	    {
	        m_hdr_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                         VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                         VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	        m_alias_table_image->GetDstMemoryBarrier(region, VK_ACCESS_TRANSFER_WRITE_BIT, 0,
	                                                 VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	                                                 VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL),
	    });
	command_buffer->End();

	command_buffer->Submit(fence);
	fence->Wait();
}